

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O2

void __thiscall gvr::Mesh::loadPLY(Mesh *this,PLYReader *ply)

{
  bool bVar1;
  ply_type pVar2;
  ply_type pVar3;
  ply_type pVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  string local_398;
  allocator local_376;
  allocator local_375;
  allocator local_374;
  allocator local_373;
  allocator local_372;
  allocator local_371;
  allocator local_370;
  allocator local_36f;
  allocator local_36e;
  allocator local_36d;
  allocator local_36c;
  allocator local_36b;
  allocator local_36a;
  allocator local_369;
  string local_368;
  FloatArrayReceiver sx;
  FloatArrayReceiver ss;
  FloatArrayReceiver nx;
  FloatArrayReceiver sy;
  FloatArrayReceiver se;
  FloatArrayReceiver ny;
  FloatArrayReceiver vx;
  string local_268;
  string local_248;
  long local_228;
  TriangleReceiver tr;
  FloatArrayReceiver vy;
  FloatArrayReceiver sc;
  FloatArrayReceiver vz;
  FloatArrayReceiver nz;
  FloatArrayReceiver sz;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&vx,"vertex",(allocator *)&vy);
  lVar5 = PLYReader::instancesOfElement(ply,(string *)&vx);
  std::__cxx11::string::~string((string *)&vx);
  Model::setOriginFromPLY((Model *)this,ply);
  std::__cxx11::string::string((string *)&vx,"vertex",(allocator *)&se);
  std::__cxx11::string::string((string *)&vy,"scan_size",(allocator *)&sc);
  local_228 = lVar5;
  pVar2 = PLYReader::getTypeOfProperty(ply,(string *)&vx,(string *)&vy);
  uVar6 = 1;
  if (pVar2 == ply_none) {
    std::__cxx11::string::string((string *)&local_50,"vertex",&local_369);
    std::__cxx11::string::string((string *)&local_70,"scan_error",&local_36a);
    pVar3 = PLYReader::getTypeOfProperty(ply,&local_50,&local_70);
    if (pVar3 != ply_none) goto LAB_0011c01c;
    std::__cxx11::string::string((string *)&local_90,"vertex",&local_36b);
    std::__cxx11::string::string((string *)&local_b0,"scan_conf",&local_36c);
    pVar3 = PLYReader::getTypeOfProperty(ply,&local_90,&local_b0);
    uVar6 = (ulong)(pVar3 != ply_none);
    bVar7 = true;
  }
  else {
LAB_0011c01c:
    bVar7 = false;
  }
  std::__cxx11::string::string((string *)&vz,"vertex",(allocator *)&sx);
  std::__cxx11::string::string((string *)&ss,"sx",(allocator *)&sy);
  pVar3 = PLYReader::getTypeOfProperty(ply,(string *)&vz,(string *)&ss);
  if (pVar3 != ply_none) {
    std::__cxx11::string::string((string *)&local_d0,"vertex",&local_36d);
    std::__cxx11::string::string((string *)&local_f0,"sy",&local_36e);
    pVar4 = PLYReader::getTypeOfProperty(ply,&local_d0,&local_f0);
    if (pVar4 != ply_none) {
      std::__cxx11::string::string((string *)&local_110,"vertex",&local_36f);
      std::__cxx11::string::string((string *)&local_130,"sz",&local_370);
      PLYReader::getTypeOfProperty(ply,&local_110,&local_130);
      bVar1 = true;
      goto LAB_0011c122;
    }
  }
  bVar1 = false;
LAB_0011c122:
  (*(this->super_PointCloud).super_Model._vptr_Model[9])(this,local_228,uVar6);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
  }
  if (pVar3 != ply_none) {
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&vz);
  if (bVar7) {
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (pVar2 == ply_none) {
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&vy);
  std::__cxx11::string::~string((string *)&vx);
  FloatArrayReceiver::FloatArrayReceiver(&vx,(this->super_PointCloud).vertex,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&vy,(this->super_PointCloud).vertex,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&vz,(this->super_PointCloud).vertex,3,2);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"x",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vx.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"y",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vy.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"z",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vz.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  FloatArrayReceiver::FloatArrayReceiver(&ss,(this->super_PointCloud).scanprop,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&se,(this->super_PointCloud).scanprop,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&sc,(this->super_PointCloud).scanprop,3,2);
  if ((this->super_PointCloud).scanprop != (float *)0x0) {
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_size",(allocator *)&nx);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&ss.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_error",(allocator *)&nx);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&se.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_conf",(allocator *)&nx);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&sc.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
  }
  FloatArrayReceiver::FloatArrayReceiver(&sx,(this->super_PointCloud).scanpos,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&sy,(this->super_PointCloud).scanpos,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&sz,(this->super_PointCloud).scanpos,3,2);
  if ((this->super_PointCloud).scanpos != (float *)0x0) {
    std::__cxx11::string::string((string *)&nx,"vertex",(allocator *)&nz);
    std::__cxx11::string::string((string *)&ny,"sx",(allocator *)&local_398);
    PLYReader::setReceiver(ply,(string *)&nx,(string *)&ny,&sx.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&ny);
    std::__cxx11::string::~string((string *)&nx);
    std::__cxx11::string::string((string *)&nx,"vertex",(allocator *)&nz);
    std::__cxx11::string::string((string *)&ny,"sy",(allocator *)&local_398);
    PLYReader::setReceiver(ply,(string *)&nx,(string *)&ny,&sy.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&ny);
    std::__cxx11::string::~string((string *)&nx);
    std::__cxx11::string::string((string *)&nx,"vertex",(allocator *)&nz);
    std::__cxx11::string::string((string *)&ny,"sz",(allocator *)&local_398);
    PLYReader::setReceiver(ply,(string *)&nx,(string *)&ny,&sz.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&ny);
    std::__cxx11::string::~string((string *)&nx);
  }
  FloatArrayReceiver::FloatArrayReceiver(&nx,this->normal,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&ny,this->normal,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&nz,this->normal,3,2);
  std::__cxx11::string::string((string *)&local_398,"vertex",(allocator *)&local_248);
  std::__cxx11::string::string((string *)&local_368,"nx",(allocator *)&local_268);
  PLYReader::setReceiver(ply,&local_398,&local_368,&nx.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::string((string *)&local_398,"vertex",(allocator *)&local_248);
  std::__cxx11::string::string((string *)&local_368,"ny",(allocator *)&local_268);
  PLYReader::setReceiver(ply,&local_398,&local_368,&ny.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::string((string *)&local_398,"vertex",(allocator *)&local_248);
  std::__cxx11::string::string((string *)&local_368,"nz",(allocator *)&local_268);
  PLYReader::setReceiver(ply,&local_398,&local_368,&nz.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::string((string *)&local_398,"face",(allocator *)&local_368);
  uVar6 = PLYReader::instancesOfElement(ply,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  (*(this->super_PointCloud).super_Model._vptr_Model[10])(this,uVar6 & 0xffffffff);
  tr.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&PTR_setValue_001319b0;
  tr.p = this;
  std::__cxx11::string::string((string *)&local_398,"face",(allocator *)&local_248);
  std::__cxx11::string::string((string *)&local_368,"vertex_index",(allocator *)&local_268);
  PLYReader::setReceiver(ply,&local_398,&local_368,&tr.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::string((string *)&local_398,"face",(allocator *)&local_248);
  std::__cxx11::string::string((string *)&local_368,"vertex_indices",(allocator *)&local_268);
  PLYReader::setReceiver(ply,&local_398,&local_368,&tr.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_398);
  PLYReader::readData(ply);
  std::__cxx11::string::string((string *)&local_398,"vertex",&local_371);
  std::__cxx11::string::string((string *)&local_368,"nx",&local_372);
  pVar2 = PLYReader::getTypeOfProperty(ply,&local_398,&local_368);
  if (pVar2 == ply_none) {
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_398);
  }
  else {
    std::__cxx11::string::string((string *)&local_248,"vertex",&local_373);
    std::__cxx11::string::string((string *)&local_268,"ny",&local_374);
    pVar2 = PLYReader::getTypeOfProperty(ply,&local_248,&local_268);
    if (pVar2 == ply_none) {
      bVar7 = true;
    }
    else {
      std::__cxx11::string::string((string *)&local_150,"vertex",&local_375);
      std::__cxx11::string::string((string *)&local_170,"nz",&local_376);
      pVar2 = PLYReader::getTypeOfProperty(ply,&local_150,&local_170);
      bVar7 = pVar2 == ply_none;
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
    }
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_398);
    if (!bVar7) {
      normalizeNormals(this);
      return;
    }
  }
  recalculateNormals(this);
  return;
}

Assistant:

void Mesh::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // set receiver for vertices

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  FloatArrayReceiver nx(getNormalArray(), 3, 0), ny(getNormalArray(), 3, 1), nz(getNormalArray(), 3,
      2);

  ply.setReceiver("vertex", "nx", &nx);
  ply.setReceiver("vertex", "ny", &ny);
  ply.setReceiver("vertex", "nz", &nz);

  // set receiver for triangles

  int tn=static_cast<int>(ply.instancesOfElement("face"));

  resizeTriangleList(tn);

  TriangleReceiver tr(*this);

  ply.setReceiver("face", "vertex_index", &tr);
  ply.setReceiver("face", "vertex_indices", &tr);

  // read data and calculate normals

  ply.readData();

  if (ply.getTypeOfProperty("vertex", "nx") == ply_none ||
      ply.getTypeOfProperty("vertex", "ny") == ply_none ||
      ply.getTypeOfProperty("vertex", "nz") == ply_none)
  {
    recalculateNormals();
  }
  else
  {
    normalizeNormals();
  }
}